

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O2

Vec_Int_t * Llb_ManCollectHighFanoutObjects(Aig_Man_t *pAig,int nCandMax,int fCisOnly)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int Entry;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  pVVar5 = Vec_IntAlloc(100);
  for (iVar10 = 0; iVar10 < pAig->vObjs->nSize; iVar10 = iVar10 + 1) {
    piVar6 = (int *)Vec_PtrEntry(pAig->vObjs,iVar10);
    if (piVar6 != (int *)0x0) {
      uVar8 = (uint)*(ulong *)(piVar6 + 6);
      if ((((uVar8 & 7) == 2) && (pAig->nTruePis <= *piVar6)) ||
         ((fCisOnly == 0 && (0xfffffffd < (uVar8 & 7) - 7)))) {
        Vec_IntPush(pVVar5,(uint)(*(ulong *)(piVar6 + 6) >> 6) & 0x3ffffff);
      }
    }
  }
  piVar6 = pVVar5->pArray;
  iVar10 = pVVar5->nSize;
  qsort(piVar6,(long)iVar10,4,Vec_IntSortCompare2);
  iVar10 = iVar10 + -1;
  if (nCandMax < iVar10) {
    iVar10 = nCandMax;
  }
  iVar3 = Vec_IntEntry(pVVar5,iVar10);
  free(piVar6);
  free(pVVar5);
  pVVar5 = Vec_IntAlloc(100);
  for (iVar9 = 0; iVar9 < pAig->vObjs->nSize; iVar9 = iVar9 + 1) {
    piVar6 = (int *)Vec_PtrEntry(pAig->vObjs,iVar9);
    if (piVar6 != (int *)0x0) {
      uVar8 = (uint)*(ulong *)(piVar6 + 6);
      if (((((uVar8 & 7) == 2) && (pAig->nTruePis <= *piVar6)) ||
          ((fCisOnly == 0 && (0xfffffffd < (uVar8 & 7) - 7)))) &&
         (iVar3 <= (int)((uint)(*(ulong *)(piVar6 + 6) >> 6) & 0x3ffffff))) {
        Vec_IntPush(pVVar5,piVar6[9]);
      }
    }
  }
  iVar3 = pVVar5->nSize;
  if (iVar10 <= iVar3) {
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    iVar10 = 0;
    bVar2 = false;
    do {
      while (bVar1 = bVar2, iVar9 = iVar10, iVar10 = iVar9 + 1, iVar3 != iVar10) {
        iVar4 = Vec_IntEntry(pVVar5,iVar9);
        pAVar7 = Aig_ManObj(pAig,iVar4);
        uVar8 = *(uint *)&pAVar7->field_0x18;
        iVar4 = Vec_IntEntry(pVVar5,iVar10);
        pAVar7 = Aig_ManObj(pAig,iVar4);
        bVar2 = bVar1;
        if (uVar8 >> 6 < *(uint *)&pAVar7->field_0x18 >> 6) {
          iVar4 = Vec_IntEntry(pVVar5,iVar9);
          Entry = Vec_IntEntry(pVVar5,iVar10);
          Vec_IntWriteEntry(pVVar5,iVar9,Entry);
          Vec_IntWriteEntry(pVVar5,iVar10,iVar4);
          bVar2 = true;
        }
      }
      iVar10 = 0;
      bVar2 = false;
    } while (bVar1);
    return pVVar5;
  }
  __assert_fail("Vec_IntSize(vResult) >= nCandMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                ,0x7f,"Vec_Int_t *Llb_ManCollectHighFanoutObjects(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Int_t * Llb_ManCollectHighFanoutObjects( Aig_Man_t * pAig, int nCandMax, int fCisOnly )
{
    Vec_Int_t * vFanouts, * vResult;
    Aig_Obj_t * pObj; 
    int i, fChanges, PivotValue;
//    int Entry;
    // collect fanout counts
    vFanouts = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        Vec_IntPush( vFanouts, Aig_ObjRefs(pObj) );
    }
    Vec_IntSort( vFanouts, 1 );
    // pick the separator
    nCandMax = Abc_MinInt( nCandMax, Vec_IntSize(vFanouts) - 1 );
    PivotValue = Vec_IntEntry( vFanouts, nCandMax );
    Vec_IntFree( vFanouts );
    // collect obj satisfying the constraints
    vResult = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        if ( Aig_ObjRefs(pObj) < PivotValue )
            continue;
        Vec_IntPush( vResult, Aig_ObjId(pObj) );
    }
    assert( Vec_IntSize(vResult) >= nCandMax );
    // order in the decreasing order of fanouts
    do
    {
        fChanges = 0;
        for ( i = 0; i < Vec_IntSize(vResult) - 1; i++ )
            if ( Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i))) < 
                 Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i+1))) )
            {
                int Temp = Vec_IntEntry( vResult, i );
                Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vResult, i+1) );
                Vec_IntWriteEntry( vResult, i+1, Temp );
                fChanges = 1;
            }
    }
    while ( fChanges );
/*
    Vec_IntForEachEntry( vResult, Entry, i )
        printf( "%d ", Aig_ObjRefs(Aig_ManObj(pAig, Entry)) );
printf( "\n" );
*/
    return vResult;
}